

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void * __thiscall
google::protobuf::Reflection::MutableRawRepeatedField
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpptype,int ctype,
          Descriptor *desc)

{
  FieldDescriptor field_type;
  uint uVar1;
  int number;
  bool bVar2;
  uint32 uVar3;
  Descriptor *pDVar4;
  LogMessage *pLVar5;
  MapFieldBase *this_00;
  FieldDescriptor *local_78;
  FieldDescriptor *local_70;
  LogMessage local_68;
  
  if (*(int *)(field + 0x3c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"\"MutableRawRepeatedField\"",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_68._0_8_ = FieldDescriptor::TypeOnceInit;
    local_78 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_68,&local_78)
    ;
  }
  if (*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) !=
      cpptype) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_68._0_8_ = FieldDescriptor::TypeOnceInit;
      local_78 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_68,
                 &local_78);
    }
    if ((cpptype != CPPTYPE_INT32) ||
       (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 8)) {
      anon_unknown_0::ReportReflectionUsageTypeError
                (this->descriptor_,field,"MutableRawRepeatedField",cpptype);
    }
  }
  if ((desc != (Descriptor *)0x0) && (pDVar4 = FieldDescriptor::message_type(field), pDVar4 != desc)
     ) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x6ad);
    pLVar5 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (field->message_type()) == (desc): ");
    pLVar5 = internal::LogMessage::operator<<(pLVar5,"wrong submessage type");
    internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar5);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    uVar1 = (this->schema_).extensions_offset_;
    number = *(int *)(field + 0x44);
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_78 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
      local_70 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_78,
                 &local_70);
    }
    field_type = field[0x38];
    bVar2 = FieldDescriptor::is_packed(field);
    this_00 = (MapFieldBase *)
              internal::ExtensionSet::MutableRawRepeatedField
                        ((ExtensionSet *)
                         ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),
                         number,(FieldType)field_type,bVar2,field);
  }
  else {
    bVar2 = anon_unknown_0::IsMapFieldInApi(field);
    uVar3 = internal::ReflectionSchema::GetFieldOffsetNonOneof(&this->schema_,field);
    this_00 = (MapFieldBase *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3)
    ;
    if (bVar2) {
      this_00 = (MapFieldBase *)internal::MapFieldBase::MutableRepeatedField(this_00);
    }
  }
  return this_00;
}

Assistant:

void* Reflection::MutableRawRepeatedField(Message* message,
                                          const FieldDescriptor* field,
                                          FieldDescriptor::CppType cpptype,
                                          int ctype,
                                          const Descriptor* desc) const {
  USAGE_CHECK_REPEATED("MutableRawRepeatedField");
  if (field->cpp_type() != cpptype &&
      (field->cpp_type() != FieldDescriptor::CPPTYPE_ENUM ||
       cpptype != FieldDescriptor::CPPTYPE_INT32))
    ReportReflectionUsageTypeError(descriptor_, field,
                                   "MutableRawRepeatedField", cpptype);
  if (desc != nullptr)
    GOOGLE_CHECK_EQ(field->message_type(), desc) << "wrong submessage type";
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    // Trigger transform for MapField
    if (IsMapFieldInApi(field)) {
      return MutableRawNonOneof<MapFieldBase>(message, field)
          ->MutableRepeatedField();
    }
    return MutableRawNonOneof<void>(message, field);
  }
}